

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall xLearn::Reader::~Reader(Reader *this)

{
  this->_vptr_Reader = (_func_int **)&PTR__Reader_00175f00;
  std::__cxx11::string::~string((string *)&this->splitor_);
  DMatrix::~DMatrix(&this->data_samples_);
  std::__cxx11::string::~string((string *)&this->filename_);
  return;
}

Assistant:

virtual ~Reader() {  }